

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTryTable(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  int iVar1;
  Tag *pTVar2;
  Expression *target;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  byte bVar3;
  bool __x;
  uint32_t uVar4;
  uint32_t uVar5;
  Expression *body;
  value_type *pvVar6;
  size_t sVar7;
  value_type *ppEVar8;
  TryTable *pTVar9;
  TranslateToFuzzReader *this_01;
  uint uVar10;
  ulong uVar11;
  Type TVar12;
  Iterator __first;
  Iterator __last;
  _Storage<wasm::Type,_true> local_130;
  uint7 uStack_127;
  _Storage<wasm::Type,_true> local_120;
  uint7 uStack_117;
  Type local_110;
  Type tagTypeWithExn;
  undefined1 auStack_f8 [8];
  Name tagName;
  undefined1 local_e0 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> vec;
  Name dest;
  undefined1 auStack_78 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchDests;
  undefined1 auStack_58 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchTags;
  Type local_38;
  
  body = make(this,type);
  if ((this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    auStack_58 = (undefined1  [8])0x0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_78 = (undefined1  [8])0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dest.super_IString.str._M_str = (char *)0x0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)uStack_127 << 8;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_130;
    pTVar9 = Builder::makeTryTable
                       (&this->builder,body,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78,
                        (vector<bool,_std::allocator<bool>_> *)&dest.super_IString.str._M_str,
                        type_01);
  }
  else {
    if (*(long *)(this->wasm + 0x48) == *(long *)(this->wasm + 0x50)) {
      addTag(this);
    }
    auStack_58 = (undefined1  [8])0x0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uVar11 = 0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_78 = (undefined1  [8])0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dest.super_IString.str._M_str = (char *)0x0;
    this_00 = &this->random;
    uVar4 = Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).MAX_TRY_CATCHES);
    do {
      auStack_f8 = (undefined1  [8])0x0;
      tagName.super_IString.str._M_len = 0;
      local_38.id = 0;
      if ((uint)uVar11 < uVar4) {
        pvVar6 = Random::
                 pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                           (this_00,(vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                     *)(this->wasm + 0x48));
        pTVar2 = (pvVar6->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                 super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
        auStack_f8 = *(undefined1 (*) [8])&(pTVar2->super_Importable).super_Named;
        tagName.super_IString.str._M_len =
             *(size_t *)((long)&(pTVar2->super_Importable).super_Named + 8);
        local_38.id = wasm::HeapType::getSignature();
      }
      else {
        if ((auStack_58 !=
             (undefined1  [8])
             catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start) && (uVar5 = Random::upTo(this_00,2), uVar5 == 0))
        break;
        local_38.id = 0;
      }
      sVar7 = Type::size(&local_38);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_38
      ;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar7;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_38;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_e0,__first,__last,
                 (allocator_type *)
                 &vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x48;
      if (vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_e0,
                   (iterator)
                   vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (Type *)&vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      }
      else {
        (vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = 0x48;
        vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      tagTypeWithExn.id = uVar11;
      wasm::Type::Type(&local_110,local_e0);
      iVar1 = (this->fuzzParams->super_FuzzParams).TRIES;
      if (0 < iVar1) {
        uVar10 = iVar1 + 1;
        do {
          this_01 = (TranslateToFuzzReader *)this_00;
          ppEVar8 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                              (this_00,&this->funcContext->breakableStack);
          target = *ppEVar8;
          join_0x00000010_0x00000000_ = (string_view)getTargetName(this_01,target);
          if (target->_id == LoopId) {
            TVar12.id = 0;
          }
          else {
            if (target->_id != BlockId) {
              wasm::handle_unreachable
                        ("unexpected expr type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                         ,0x15f4);
            }
            TVar12.id = (target->type).id;
          }
          bVar3 = wasm::Type::isSubType(local_38,TVar12);
          __x = (bool)wasm::Type::isSubType(local_110,TVar12);
          if ((bVar3 | __x) == 1) {
            if (catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start ==
                catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<wasm::Name,std::allocator<wasm::Name>>::
              _M_realloc_insert<wasm::Name_const&>
                        ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_58,
                         (iterator)
                         catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                         _M_impl.super__Vector_impl_data._M_start,(Name *)auStack_f8);
            }
            else {
              ((catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_len = (size_t)auStack_f8;
              ((catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_str =
                   (char *)tagName.super_IString.str._M_len;
              catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start =
                   catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            if (catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start ==
                catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<wasm::Name,std::allocator<wasm::Name>>::
              _M_realloc_insert<wasm::Name_const&>
                        ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_78,
                         (iterator)
                         catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (Name *)&vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              ((catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_len =
                   (size_t)vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              ((catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_str =
                   (char *)dest.super_IString.str._M_len;
              catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start =
                   catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&dest.super_IString.str._M_str,__x);
            break;
          }
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
      if (local_e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_e0,
                        (long)vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_e0);
      }
      uVar10 = (int)tagTypeWithExn.id + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 <= uVar4);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)uStack_117 << 8;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_120;
    pTVar9 = Builder::makeTryTable
                       (&this->builder,body,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78,
                        (vector<bool,_std::allocator<bool>_> *)&dest.super_IString.str._M_str,
                        type_00);
  }
  if (dest.super_IString.str._M_str != (char *)0x0) {
    operator_delete(dest.super_IString.str._M_str,-(long)dest.super_IString.str._M_str);
  }
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78,
                    (long)catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return (Expression *)pTVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeTryTable(Type type) {
  auto* body = make(type);

  if (funcContext->breakableStack.empty()) {
    // Nothing to break to, emit a trivial TryTable.
    // TODO: Perhaps generate a block wrapping us?
    return builder.makeTryTable(body, {}, {}, {});
  }

  if (wasm.tags.empty()) {
    addTag();
  }

  // Add catches of specific tags, and possibly a catch_all at the end. We use
  // the last iteration of the loop for that.
  std::vector<Name> catchTags;
  std::vector<Name> catchDests;
  std::vector<bool> catchRefs;
  auto numCatches = upTo(fuzzParams->MAX_TRY_CATCHES);
  for (Index i = 0; i <= numCatches; i++) {
    Name tagName;
    Type tagType;
    if (i < numCatches) {
      // Look for a specific tag.
      auto& tag = pick(wasm.tags);
      tagName = tag->name;
      tagType = tag->params();
    } else {
      // Add a catch_all at the end, some of the time (but all of the time if we
      // have nothing else).
      if (!catchTags.empty() && oneIn(2)) {
        break;
      }
      tagType = Type::none;
    }

    // We need to find a proper target to break to, which means a target that
    // has the type of the tag, or the tag + an exnref at the end.
    std::vector<Type> vec(tagType.begin(), tagType.end());
    // Use a non-nullable exnref here, and then the subtyping check below will
    // also accept a target that is nullable.
    vec.push_back(Type(HeapType::exn, NonNullable));
    auto tagTypeWithExn = Type(vec);
    int tries = fuzzParams->TRIES;
    while (tries-- > 0) {
      auto* target = pick(funcContext->breakableStack);
      auto dest = getTargetName(target);
      auto valueType = getTargetType(target);
      auto subOfTagType = Type::isSubType(tagType, valueType);
      auto subOfTagTypeWithExn = Type::isSubType(tagTypeWithExn, valueType);
      if (subOfTagType || subOfTagTypeWithExn) {
        catchTags.push_back(tagName);
        catchDests.push_back(dest);
        catchRefs.push_back(subOfTagTypeWithExn);
        break;
      }
    }
    // TODO: Perhaps generate a block wrapping us, if we fail to find a target?
    // TODO: It takes a bit of luck to find a target with an exnref - perhaps
    //       generate those?
  }

  return builder.makeTryTable(body, catchTags, catchDests, catchRefs);
}